

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::animationFinished(QMainWindowLayout *this,QWidget *widget)

{
  QList<QDockAreaLayoutItem> *__last;
  QWidgetData *pQVar1;
  QLayoutItem *pQVar2;
  QDockAreaLayoutItem *pQVar3;
  long lVar4;
  Data *pDVar5;
  QWidget **ppQVar6;
  qsizetype qVar7;
  Data *pDVar8;
  undefined8 uVar9;
  QMainWindow *pQVar10;
  QTabBar *pQVar11;
  Alignment AVar12;
  undefined4 uVar13;
  undefined7 uVar14;
  Data *pDVar15;
  undefined1 auVar16 [8];
  _func_int *p_Var17;
  bool bVar18;
  QWidget *pQVar19;
  QToolBarLayout *this_00;
  QLayout *pQVar20;
  QDockAreaLayoutInfo *pQVar21;
  QLayout *pQVar22;
  QDockAreaLayoutInfo *this_01;
  pointer pQVar23;
  iterator iVar24;
  quintptr id;
  QWidget *pQVar25;
  long lVar26;
  _Iter in_R8;
  QSize QVar27;
  _func_int *p_Var28;
  long in_FS_OFFSET;
  insert_iterator<QList<QDockAreaLayoutItem>_> __result;
  QSet<QTabBar_*> usedTabBarsCopy;
  QList<int> local_e8;
  QArrayDataPointer<QDockAreaLayoutItem> local_c8;
  undefined1 local_a8 [8];
  QArrayDataPointer<QWidget_*> QStack_a0;
  QLayoutItem *local_88;
  QMainWindow *pQStack_80;
  undefined1 local_78 [16];
  QArrayDataPointer<QDockAreaLayoutItem> local_68;
  qsizetype local_50;
  QTabBar *pQStack_48;
  Representation local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar19 = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (pQVar19 != (QWidget *)0x0) {
    QWidget::layout(pQVar19);
    this_00 = (QToolBarLayout *)QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
    if ((this_00->super_QLayout).super_QLayoutItem.field_0xd == '\x01') {
      (this_00->super_QLayout).super_QLayoutItem.field_0xd = 0;
      if ((this_00->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        pQVar1 = pQVar19->data;
        local_a8._0_4_ = ((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1;
        local_a8._4_4_ = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
        QToolBarLayout::layoutActions(this_00,(QSize *)local_a8);
      }
      QWidget::update(pQVar19);
    }
  }
  if (*(QWidget **)(this + 0x7d8) == widget) {
    pQVar19 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    if (pQVar19 != (QWidget *)0x0) {
      QToolBarAreaLayout::clear((QToolBarAreaLayout *)(this + 0x3d8));
      QDockAreaLayout::clear((QDockAreaLayout *)(this + 0x4d8));
      *(undefined8 *)(this + 0x3c0) = 0;
      *(undefined8 *)(this + 0x3c8) = 0xffffffffffffffff;
      pQVar20 = QWidget::layout(pQVar19);
      pQVar21 = QDockWidgetGroupWindow::tabLayoutInfo((QDockWidgetGroupWindow *)pQVar19);
      local_e8.d.d = (Data *)0x0;
      local_e8.d.ptr = (int *)0x0;
      local_e8.d.size = 0;
      if (((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) ||
         (*(long *)(this + 0x7f8) == 0)) {
        QDockAreaLayout::indexOf((QList<int> *)local_a8,(QDockAreaLayout *)(this + 0x1a0),widget);
        local_e8.d.size = (qsizetype)QStack_a0.ptr;
        local_e8.d.ptr = (int *)QStack_a0.d;
        auVar16 = local_a8;
        pDVar15 = local_e8.d.d;
        QStack_a0.ptr = (QWidget **)0x0;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        QStack_a0.d = (Data *)0x0;
        local_e8.d.d = (Data *)auVar16;
        if (&pDVar15->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar15->super_QArrayData,4,0x10);
          }
        }
        if ((QSize)local_a8 != (QSize)0x0) {
          LOCK();
          *(int *)local_a8 = *(int *)local_a8 + -1;
          UNLOCK();
          if (*(int *)local_a8 == 0) {
            QArrayData::deallocate((QArrayData *)local_a8,4,0x10);
          }
        }
        this_01 = QDockAreaLayout::info((QDockAreaLayout *)(this + 0x1a0),&local_e8);
      }
      else {
        pQVar22 = QWidget::layout(*(QWidget **)(this + 0x7f8));
        QDockAreaLayoutInfo::indexOf
                  ((QList<int> *)local_a8,(QDockAreaLayoutInfo *)&pQVar22[4].super_QLayoutItem,
                   widget);
        local_e8.d.size = (qsizetype)QStack_a0.ptr;
        local_e8.d.ptr = (int *)QStack_a0.d;
        auVar16 = local_a8;
        pDVar15 = local_e8.d.d;
        QStack_a0.ptr = (QWidget **)0x0;
        local_a8._0_4_ = 0;
        local_a8._4_4_ = 0;
        QStack_a0.d = (Data *)0x0;
        local_e8.d.d = (Data *)auVar16;
        if (&pDVar15->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar15->super_QArrayData,4,0x10);
          }
        }
        if ((QSize)local_a8 != (QSize)0x0) {
          LOCK();
          *(int *)local_a8 = *(int *)local_a8 + -1;
          UNLOCK();
          if (*(int *)local_a8 == 0) {
            QArrayData::deallocate((QArrayData *)local_a8,4,0x10);
          }
        }
        pQVar22 = QWidget::layout(*(QWidget **)(this + 0x7f8));
        this_01 = QDockAreaLayoutInfo::info
                            ((QDockAreaLayoutInfo *)&pQVar22[4].super_QLayoutItem,&local_e8);
      }
      lVar26 = (long)*(int *)((long)local_e8.d.ptr + local_e8.d.size * 4 + -4);
      bVar18 = this_01->tabbed;
      __last = &this_01->item_list;
      pQVar23 = QList<QDockAreaLayoutItem>::data(__last);
      pQVar2 = pQVar23[lVar26].widgetItem;
      if ((pQVar21 == (QDockAreaLayoutInfo *)0x0) || (bVar18 == false)) {
        pQVar23 = pQVar23 + lVar26;
        if (pQVar2 != (QLayoutItem *)0x0) {
          (*pQVar2->_vptr_QLayoutItem[1])();
        }
        pQVar23->widgetItem = (QLayoutItem *)0x0;
        pQVar21 = (QDockAreaLayoutInfo *)operator_new(0x70);
        pQVar21->sep = (int *)pQVar20[4].super_QLayoutItem._vptr_QLayoutItem;
        pDVar5 = *(Data **)&pQVar20[4].super_QLayoutItem.align;
        *(undefined8 *)&pQVar20[4].super_QLayoutItem.align = 0;
        (pQVar21->separatorWidgets).d.d = pDVar5;
        ppQVar6 = *(QWidget ***)(pQVar20 + 5);
        *(undefined8 *)(pQVar20 + 5) = 0;
        (pQVar21->separatorWidgets).d.ptr = ppQVar6;
        qVar7 = *(qsizetype *)&pQVar20[5].field_0x8;
        *(undefined8 *)&pQVar20[5].field_0x8 = 0;
        (pQVar21->separatorWidgets).d.size = qVar7;
        AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i =
             pQVar20[5].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
        uVar13 = *(undefined4 *)&pQVar20[5].super_QLayoutItem.field_0xc;
        uVar9 = *(undefined8 *)(pQVar20 + 6);
        pQVar10 = *(QMainWindow **)&pQVar20[6].field_0x8;
        *(_func_int ***)&pQVar21->dockPos = pQVar20[5].super_QLayoutItem._vptr_QLayoutItem;
        (pQVar21->rect).x1 =
             (Representation)
             AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
        (pQVar21->rect).y1 = (Representation)uVar13;
        (pQVar21->rect).x2 = (Representation)(int)uVar9;
        (pQVar21->rect).y2 = (Representation)(int)((ulong)uVar9 >> 0x20);
        pQVar21->mainWindow = pQVar10;
        pDVar8 = (Data *)pQVar20[6].super_QLayoutItem._vptr_QLayoutItem;
        pQVar20[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)0x0;
        (pQVar21->item_list).d.d = pDVar8;
        pQVar3 = *(QDockAreaLayoutItem **)&pQVar20[6].super_QLayoutItem.align;
        *(undefined8 *)&pQVar20[6].super_QLayoutItem.align = 0;
        (pQVar21->item_list).d.ptr = pQVar3;
        qVar7 = *(qsizetype *)(pQVar20 + 7);
        *(undefined8 *)(pQVar20 + 7) = 0;
        (pQVar21->item_list).d.size = qVar7;
        uVar14 = *(undefined7 *)&pQVar20[7].field_0x9;
        pQVar11 = (QTabBar *)pQVar20[7].super_QLayoutItem._vptr_QLayoutItem;
        pQVar21->tabbed = (bool)pQVar20[7].field_0x8;
        *(undefined7 *)&pQVar21->field_0x59 = uVar14;
        pQVar21->tabBar = pQVar11;
        pQVar21->tabBarShape =
             pQVar20[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i;
        pQVar23->subinfo = pQVar21;
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_a8);
        pQVar20[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_a8;
        QArrayDataPointer<QWidget_*>::operator=
                  ((QArrayDataPointer<QWidget_*> *)&pQVar20[4].super_QLayoutItem.align,&QStack_a0);
        qVar7 = local_68.size;
        pQVar3 = local_68.ptr;
        pDVar8 = local_68.d;
        *(undefined8 *)(pQVar20 + 6) = local_78._0_8_;
        *(undefined8 *)&pQVar20[6].field_0x8 = local_78._8_8_;
        pQVar20[5].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_88;
        *(QMainWindow **)&pQVar20[5].super_QLayoutItem.align = pQStack_80;
        local_68.d = (Data *)0x0;
        local_68.ptr = (QDockAreaLayoutItem *)0x0;
        local_68.size = 0;
        local_c8.d = (Data *)pQVar20[6].super_QLayoutItem._vptr_QLayoutItem;
        local_c8.ptr = *(QDockAreaLayoutItem **)&pQVar20[6].super_QLayoutItem.align;
        pQVar20[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar8;
        *(QDockAreaLayoutItem **)&pQVar20[6].super_QLayoutItem.align = pQVar3;
        local_c8.size = *(qsizetype *)(pQVar20 + 7);
        *(qsizetype *)(pQVar20 + 7) = qVar7;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_c8);
        pQVar20[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i = local_40.m_i;
        *(qsizetype *)&pQVar20[7].field_0x8 = local_50;
        pQVar20[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQStack_48;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_68);
        if (&(QStack_a0.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(QStack_a0.d)->super_QArrayData,8,0x10);
          }
        }
        pQVar21 = pQVar23->subinfo;
        lVar26 = *(long *)(this + 0x7f0);
        if (((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) || (*(long *)(this + 0x7f8) == 0)) {
          pQVar25 = QLayout::parentWidget((QLayout *)this);
        }
        else if ((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) {
          pQVar25 = (QWidget *)0x0;
        }
        else {
          pQVar25 = *(QWidget **)(this + 0x7f8);
        }
        QDockAreaLayoutInfo::reparentWidgets(pQVar21,pQVar25);
        QDockAreaLayoutInfo::setTabBarShape(pQVar23->subinfo,this_01->tabBarShape);
      }
      else {
        if (pQVar2 != (QLayoutItem *)0x0) {
          (*pQVar2->_vptr_QLayoutItem[1])();
        }
        QList<QDockAreaLayoutItem>::removeAt(__last,lVar26);
        pQVar3 = (pQVar21->item_list).d.ptr;
        lVar4 = (pQVar21->item_list).d.size;
        iVar24 = QList<QDockAreaLayoutItem>::begin(__last);
        __result.iter.i = in_R8.i;
        __result.container = (QList<QDockAreaLayoutItem> *)(iVar24.i + lVar26);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<QList<QDockAreaLayoutItem>::const_iterator,std::insert_iterator<QList<QDockAreaLayoutItem>>>
                  ((__copy_move<false,false,std::random_access_iterator_tag> *)pQVar3,pQVar3 + lVar4
                   ,(const_iterator)__last,__result);
        id = QDockAreaLayoutInfo::currentTabId(pQVar21);
        QDockAreaLayoutInfo::QDockAreaLayoutInfo((QDockAreaLayoutInfo *)local_a8);
        pQVar20[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_a8;
        QArrayDataPointer<QWidget_*>::operator=
                  ((QArrayDataPointer<QWidget_*> *)&pQVar20[4].super_QLayoutItem.align,&QStack_a0);
        qVar7 = local_68.size;
        pQVar3 = local_68.ptr;
        pDVar8 = local_68.d;
        *(undefined8 *)(pQVar20 + 6) = local_78._0_8_;
        *(undefined8 *)&pQVar20[6].field_0x8 = local_78._8_8_;
        pQVar20[5].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_88;
        *(QMainWindow **)&pQVar20[5].super_QLayoutItem.align = pQStack_80;
        local_68.d = (Data *)0x0;
        local_68.ptr = (QDockAreaLayoutItem *)0x0;
        local_68.size = 0;
        local_c8.d = (Data *)pQVar20[6].super_QLayoutItem._vptr_QLayoutItem;
        local_c8.ptr = *(QDockAreaLayoutItem **)&pQVar20[6].super_QLayoutItem.align;
        pQVar20[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar8;
        *(QDockAreaLayoutItem **)&pQVar20[6].super_QLayoutItem.align = pQVar3;
        local_c8.size = *(qsizetype *)(pQVar20 + 7);
        *(qsizetype *)(pQVar20 + 7) = qVar7;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_c8);
        pQVar20[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i = local_40.m_i;
        *(qsizetype *)&pQVar20[7].field_0x8 = local_50;
        pQVar20[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQStack_48;
        QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_68);
        if (&(QStack_a0.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QStack_a0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(QStack_a0.d)->super_QArrayData,8,0x10);
          }
        }
        lVar26 = *(long *)(this + 0x7f0);
        if (((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) || (*(long *)(this + 0x7f8) == 0)) {
          pQVar25 = QLayout::parentWidget((QLayout *)this);
        }
        else if ((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) {
          pQVar25 = (QWidget *)0x0;
        }
        else {
          pQVar25 = *(QWidget **)(this + 0x7f8);
        }
        QDockAreaLayoutInfo::reparentWidgets(this_01,pQVar25);
        QDockAreaLayoutInfo::updateTabBar(this_01);
        QDockAreaLayoutInfo::setCurrentTabId(this_01,id);
      }
      QDockWidgetGroupWindow::destroyOrHideIfEmpty((QDockWidgetGroupWindow *)pQVar19);
      if ((QSize)local_e8.d.d != (QSize)0x0) {
        LOCK();
        *(int *)local_e8.d.d = *(int *)local_e8.d.d + -1;
        UNLOCK();
        if (*(int *)local_e8.d.d == 0) {
          QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    pQVar19 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (pQVar19 != (QWidget *)0x0) {
      lVar26 = *(long *)(this + 0x7f0);
      if (((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) || (*(long *)(this + 0x7f8) == 0)) {
        pQVar25 = QLayout::parentWidget((QLayout *)this);
      }
      else if ((lVar26 == 0) || (*(int *)(lVar26 + 4) == 0)) {
        pQVar25 = (QWidget *)0x0;
      }
      else {
        pQVar25 = *(QWidget **)(this + 0x7f8);
      }
      QWidget::setParent(pQVar19,pQVar25);
      QWidget::show(pQVar19);
      QDockWidgetPrivate::plug(*(QDockWidgetPrivate **)&pQVar19->field_0x8,(QRect *)(this + 0x7c8));
    }
    lVar26 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
    if (lVar26 != 0) {
      QToolBarPrivate::plug(*(QToolBarPrivate **)(lVar26 + 8),(QRect *)(this + 0x7c8));
    }
    QToolBarAreaLayout::clear((QToolBarAreaLayout *)(this + 0x3d8));
    QDockAreaLayout::clear((QDockAreaLayout *)(this + 0x4d8));
    *(undefined8 *)(this + 0x3c0) = 0;
    *(undefined8 *)(this + 0x3c8) = 0xffffffffffffffff;
    QList<int>::clear((QList<int> *)(this + 0x7b0));
    *(undefined8 *)(this + 0x7d8) = 0;
    setCurrentHoveredFloat(this,(QDockWidgetGroupWindow *)0x0);
    QToolBarAreaLayout::apply((QToolBarAreaLayout *)(this + 0xa0),false);
    QDockAreaLayout::apply((QDockAreaLayout *)(this + 0x1a0),false);
    lVar26 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if ((lVar26 != 0) && (pQVar21 = dockInfo(this,widget), pQVar21 != (QDockAreaLayoutInfo *)0x0)) {
      QDockAreaLayoutInfo::setCurrentTab(pQVar21,widget);
    }
  }
  bVar18 = QWidgetAnimator::animating((QWidgetAnimator *)(this + 0x790));
  if (bVar18) goto LAB_0043e583;
  pQVar19 = QLayout::parentWidget((QLayout *)this);
  QDockAreaLayout::separatorRegion((QDockAreaLayout *)local_a8);
  QWidget::update(pQVar19,(QRegion *)local_a8);
  QRegion::~QRegion((QRegion *)local_a8);
  local_a8 = *(undefined1 (*) [8])(this + 0x718);
  if (((QSize)local_a8 != (QSize)0x0) && (*(int *)local_a8 != -1)) {
    LOCK();
    *(int *)local_a8 = *(int *)local_a8 + 1;
    UNLOCK();
  }
  if ((QSize)local_a8 == (QSize)0x0) {
    QVar27.wd.m_i = 0;
    QVar27.ht.m_i = 0;
LAB_0043e4fc:
    p_Var28 = (_func_int *)0x0;
  }
  else {
    QVar27 = (QSize)local_a8;
    if (**(_func_int **)((long)local_a8 + 0x20) != (_func_int)0xff) goto LAB_0043e4fc;
    p_Var17 = (_func_int *)0x1;
    do {
      p_Var28 = p_Var17;
      if (*(_func_int **)((long)local_a8 + 0x10) == p_Var28) {
        QVar27.wd.m_i = 0;
        QVar27.ht.m_i = 0;
        p_Var28 = (_func_int *)0x0;
        break;
      }
      p_Var17 = p_Var28 + 1;
    } while ((*(_func_int **)((long)local_a8 + 0x20))
             [(ulong)((uint)p_Var28 & 0x7f) + ((ulong)p_Var28 >> 7) * 0x90] == (_func_int)0xff);
  }
  if (QVar27 != (QSize)0x0 || p_Var28 != (_func_int *)0x0) {
    do {
      lVar26 = ((ulong)p_Var28 >> 7) * 0x90;
      QWidget::show(*(QWidget **)
                     (*(long *)(*(_func_int **)((long)QVar27 + 0x20) + lVar26 + 0x80) +
                     (ulong)(byte)(*(_func_int **)((long)QVar27 + 0x20))
                                  [(ulong)((uint)p_Var28 & 0x7f) + lVar26] * 8));
      do {
        if (*(_func_int **)((long)QVar27 + 0x10) + -1 == p_Var28) {
          QVar27.wd.m_i = 0;
          QVar27.ht.m_i = 0;
          p_Var28 = (_func_int *)0x0;
          break;
        }
        p_Var28 = p_Var28 + 1;
      } while ((*(_func_int **)((long)QVar27 + 0x20))
               [(ulong)((uint)p_Var28 & 0x7f) + ((ulong)p_Var28 >> 7) * 0x90] == (_func_int)0xff);
    } while ((QVar27 != (QSize)0x0) || (p_Var28 != (_func_int *)0x0));
  }
  QHash<QTabBar_*,_QHashDummyValue>::~QHash((QHash<QTabBar_*,_QHashDummyValue> *)local_a8);
LAB_0043e583:
  updateGapIndicator(this);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::animationFinished(QWidget *widget)
{
    //this function is called from within the Widget Animator whenever an animation is finished
    //on a certain widget
#if QT_CONFIG(toolbar)
    if (QToolBar *tb = qobject_cast<QToolBar*>(widget)) {
        QToolBarLayout *tbl = qobject_cast<QToolBarLayout*>(tb->layout());
        if (tbl->animating) {
            tbl->animating = false;
            if (tbl->expanded)
                tbl->layoutActions(tb->size());
            tb->update();
        }
    }
#endif

    if (widget == pluggingWidget) {

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (QDockWidgetGroupWindow *dwgw = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            // When the animated widget was a QDockWidgetGroupWindow, it means each of the
            // embedded QDockWidget needs to be plugged back into the QMainWindow layout.
            savedState.clear();
            QDockAreaLayoutInfo *srcInfo = dwgw->layoutInfo();
            const QDockAreaLayoutInfo *srcTabInfo = dwgw->tabLayoutInfo();
            QDockAreaLayoutInfo *dstParentInfo;
            QList<int> dstPath;

            if (currentHoveredFloat) {
                dstPath = currentHoveredFloat->layoutInfo()->indexOf(widget);
                Q_ASSERT(dstPath.size() >= 1);
                dstParentInfo = currentHoveredFloat->layoutInfo()->info(dstPath);
            } else {
                dstPath = layoutState.dockAreaLayout.indexOf(widget);
                Q_ASSERT(dstPath.size() >= 2);
                dstParentInfo = layoutState.dockAreaLayout.info(dstPath);
            }
            Q_ASSERT(dstParentInfo);
            int idx = dstPath.constLast();
            Q_ASSERT(dstParentInfo->item_list[idx].widgetItem->widget() == dwgw);
            if (dstParentInfo->tabbed && srcTabInfo) {
                // merge the two tab widgets
                delete dstParentInfo->item_list[idx].widgetItem;
                dstParentInfo->item_list.removeAt(idx);
                std::copy(srcTabInfo->item_list.cbegin(), srcTabInfo->item_list.cend(),
                          std::inserter(dstParentInfo->item_list,
                                        dstParentInfo->item_list.begin() + idx));
                quintptr currentId = srcTabInfo->currentTabId();
                *srcInfo = QDockAreaLayoutInfo();
                dstParentInfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                   : parentWidget());
                dstParentInfo->updateTabBar();
                dstParentInfo->setCurrentTabId(currentId);
            } else {
                QDockAreaLayoutItem &item = dstParentInfo->item_list[idx];
                Q_ASSERT(item.widgetItem->widget() == dwgw);
                delete item.widgetItem;
                item.widgetItem = nullptr;
                item.subinfo = new QDockAreaLayoutInfo(std::move(*srcInfo));
                *srcInfo = QDockAreaLayoutInfo();
                item.subinfo->reparentWidgets(currentHoveredFloat ? currentHoveredFloat.data()
                                                                  : parentWidget());
                item.subinfo->setTabBarShape(dstParentInfo->tabBarShape);
            }
            dwgw->destroyOrHideIfEmpty();
        }
#endif

        if (QDockWidget *dw = qobject_cast<QDockWidget*>(widget)) {
            dw->setParent(currentHoveredFloat ? currentHoveredFloat.data() : parentWidget());
            dw->show();
            dw->d_func()->plug(currentGapRect);
        }
#endif
#if QT_CONFIG(toolbar)
        if (QToolBar *tb = qobject_cast<QToolBar*>(widget))
            tb->d_func()->plug(currentGapRect);
#endif

        savedState.clear();
        currentGapPos.clear();
        pluggingWidget = nullptr;
#if QT_CONFIG(dockwidget)
        setCurrentHoveredFloat(nullptr);
#endif
        //applying the state will make sure that the currentGap is updated correctly
        //and all the geometries (especially the one from the central widget) is correct
        layoutState.apply(false);

#if QT_CONFIG(dockwidget)
#if QT_CONFIG(tabbar)
        if (qobject_cast<QDockWidget*>(widget) != nullptr) {
            // info() might return null if the widget is destroyed while
            // animating but before the animationFinished signal is received.
            if (QDockAreaLayoutInfo *info = dockInfo(widget))
                info->setCurrentTab(widget);
        }
#endif
#endif
    }

    if (!widgetAnimator.animating()) {
        //all animations are finished
#if QT_CONFIG(dockwidget)
        parentWidget()->update(layoutState.dockAreaLayout.separatorRegion());
#if QT_CONFIG(tabbar)
        const auto usedTabBarsCopy = usedTabBars; // list potentially modified by animations
        for (QTabBar *tab_bar : usedTabBarsCopy)
            tab_bar->show();
#endif // QT_CONFIG(tabbar)
#endif // QT_CONFIG(dockwidget)
    }

    updateGapIndicator();
}